

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

double ON_GrevilleAbcissa(int order,double *knot)

{
  double dVar1;
  long lVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar4 = *knot;
  if (2 < order) {
    dVar6 = knot[(ulong)(uint)order - 2];
    if ((dVar4 != dVar6) || (NAN(dVar4) || NAN(dVar6))) {
      uVar3 = order - 1;
      dVar1 = knot[uVar3 >> 1];
      dVar7 = (dVar6 - dVar4) * 1.490116119385e-08;
      dVar5 = 0.0;
      for (lVar2 = 0; uVar3 != (uint)lVar2; lVar2 = lVar2 + 1) {
        dVar5 = dVar5 + knot[lVar2];
      }
      dVar5 = dVar5 / (double)(int)uVar3;
      dVar6 = dVar4 + dVar6;
      dVar4 = dVar5;
      if ((ABS((dVar1 + dVar1) - dVar6) <= dVar7) &&
         (ABS(dVar5 - dVar1) <= ABS(dVar5) * 1.490116119385e-08 + dVar7)) {
        return dVar1;
      }
    }
  }
  return dVar4;
}

Assistant:

double ON_GrevilleAbcissa( // get Greville abcissa
          int order,          // order (>=2)
          const double* knot  // knot[order-1] array
          )

{
  double g=0.0;
  if ( order <= 2 || knot[0] == knot[order-2]) 
  {
    g = knot[0]; // degree = 1 or fully multiple knot
  }
  else 
  {
    // g = (knot[i]+...+knot[i+degree-1])/degree
    order--;
    const double k0 = knot[0];
    const double k = knot[order/2];
    const double k1 = knot[order-1];
    const double tol = (k1-k0)*ON_SQRT_EPSILON;
    const double const_ord = (double)order;
    while ( order--) 
    {
      g += *knot++;
    }
    //g /= ((double)order);
    g /= const_ord;
    if ( fabs(2*k - (k0+k1)) <= tol && fabs(g-k) <= (fabs(g)*ON_SQRT_EPSILON+tol) )
      g = k; // sets g to exact value when knot vector is uniform
  }
  return g;
}